

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcamera.h
# Opt level: O2

Matrix * GetCameraProjectionMatrix(Matrix *__return_storage_ptr__,Camera *camera,float aspect)

{
  double top;
  
  if (camera->projection == 1) {
    top = (double)camera->fovy * 0.5;
    MatrixOrtho(__return_storage_ptr__,-((double)aspect * top),(double)aspect * top,-top,top,0.01,
                1000.0);
  }
  else if (camera->projection == 0) {
    MatrixPerspective(__return_storage_ptr__,(double)(camera->fovy * 0.017453292),(double)aspect,
                      0.01,1000.0);
  }
  else {
    __return_storage_ptr__->m5 = 0.0;
    __return_storage_ptr__->m9 = 0.0;
    __return_storage_ptr__->m13 = 0.0;
    __return_storage_ptr__->m2 = 0.0;
    __return_storage_ptr__->m7 = 0.0;
    __return_storage_ptr__->m11 = 0.0;
    __return_storage_ptr__->m6 = 0.0;
    __return_storage_ptr__->m10 = 0.0;
    __return_storage_ptr__->m14 = 0.0;
    __return_storage_ptr__->m3 = 0.0;
    __return_storage_ptr__->m4 = 0.0;
    __return_storage_ptr__->m8 = 0.0;
    __return_storage_ptr__->m12 = 0.0;
    __return_storage_ptr__->m1 = 0.0;
    __return_storage_ptr__->m0 = 1.0;
    __return_storage_ptr__->m5 = 1.0;
    __return_storage_ptr__->m10 = 1.0;
    __return_storage_ptr__->m15 = 1.0;
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix GetCameraProjectionMatrix(Camera *camera, float aspect)
{
    if (camera->projection == CAMERA_PERSPECTIVE)
    {
        return MatrixPerspective(camera->fovy*DEG2RAD, aspect, CAMERA_CULL_DISTANCE_NEAR, CAMERA_CULL_DISTANCE_FAR);
    }
    else if (camera->projection == CAMERA_ORTHOGRAPHIC)
    {
        double top = camera->fovy/2.0;
        double right = top*aspect;

        return MatrixOrtho(-right, right, -top, top, CAMERA_CULL_DISTANCE_NEAR, CAMERA_CULL_DISTANCE_FAR);
    }

    return MatrixIdentity();
}